

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safeint-test.cc
# Opt level: O1

void __thiscall SafeIntTest_MulOverflow_Test::TestBody(SafeIntTest_MulOverflow_Test *this)

{
  bool bVar1;
  undefined8 *puVar2;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  AssertHelper local_10;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = &PTR__exception_00146128;
    __cxa_throw(puVar2,&mp::OverflowError::typeinfo,std::exception::~exception);
  }
  testing::Message::Message((Message *)&local_18);
  testing::internal::AssertHelper::AssertHelper
            (&local_10,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/safeint-test.cc",0x5a
             ,
             "Expected: SafeInt<int>((-2147483647 -1)) * -1 throws an exception of type OverflowError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_10,(Message *)&local_18);
  testing::internal::AssertHelper::~AssertHelper(&local_10);
  if (local_18.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_18.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_18.ptr_ + 8))();
    }
    local_18.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = &PTR__exception_00146128;
    __cxa_throw(puVar2,&mp::OverflowError::typeinfo,std::exception::~exception);
  }
  testing::Message::Message((Message *)&local_18);
  testing::internal::AssertHelper::AssertHelper
            (&local_10,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/safeint-test.cc",0x5b
             ,
             "Expected: SafeInt<int>(2147483647 / 2) * 3 throws an exception of type OverflowError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_10,(Message *)&local_18);
  testing::internal::AssertHelper::~AssertHelper(&local_10);
  if (local_18.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_18.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_18.ptr_ + 8))();
    }
    local_18.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = &PTR__exception_00146128;
    __cxa_throw(puVar2,&mp::OverflowError::typeinfo,std::exception::~exception);
  }
  testing::Message::Message((Message *)&local_18);
  testing::internal::AssertHelper::AssertHelper
            (&local_10,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/safeint-test.cc",0x5c
             ,
             "Expected: SafeInt<int>(101) * (2147483647 / 100) throws an exception of type OverflowError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_10,(Message *)&local_18);
  testing::internal::AssertHelper::~AssertHelper(&local_10);
  if (local_18.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_18.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_18.ptr_ + 8))();
    }
    local_18.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (!bVar1) {
    testing::Message::Message((Message *)&local_18);
    testing::internal::AssertHelper::AssertHelper
              (&local_10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/safeint-test.cc",
               0x5d,
               "Expected: SafeInt<int>(-101) * (2147483647 / 100) throws an exception of type OverflowError.\n  Actual: it throws nothing."
              );
    testing::internal::AssertHelper::operator=(&local_10,(Message *)&local_18);
    testing::internal::AssertHelper::~AssertHelper(&local_10);
    if (local_18.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_18.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_18.ptr_ + 8))();
      }
      local_18.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
    bVar1 = testing::internal::AlwaysTrue();
    if (!bVar1) {
      testing::Message::Message((Message *)&local_18);
      testing::internal::AssertHelper::AssertHelper
                (&local_10,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/safeint-test.cc",
                 0x5e,
                 "Expected: SafeInt<int>(101) * -(2147483647 / 100) throws an exception of type OverflowError.\n  Actual: it throws nothing."
                );
      testing::internal::AssertHelper::operator=(&local_10,(Message *)&local_18);
      testing::internal::AssertHelper::~AssertHelper(&local_10);
      if (((local_18.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
         (local_18.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_18.ptr_ + 8))();
      }
      return;
    }
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = &PTR__exception_00146128;
    __cxa_throw(puVar2,&mp::OverflowError::typeinfo,std::exception::~exception);
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__exception_00146128;
  __cxa_throw(puVar2,&mp::OverflowError::typeinfo,std::exception::~exception);
}

Assistant:

TEST(SafeIntTest, MulOverflow) {
  EXPECT_THROW(SafeInt<int>(INT_MIN) * -1, OverflowError);
  EXPECT_THROW(SafeInt<int>(INT_MAX / 2) * 3, OverflowError);
  EXPECT_THROW(SafeInt<int>(101) * (INT_MAX / 100), OverflowError);
  EXPECT_THROW(SafeInt<int>(-101) * (INT_MAX / 100), OverflowError);
  EXPECT_THROW(SafeInt<int>(101) * -(INT_MAX / 100), OverflowError);
}